

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

int __thiscall diy::FileStorage::make_file_record(FileStorage *this,string *filename,size_t sz)

{
  int iVar1;
  ulong uVar2;
  mapped_type *this_00;
  int __type;
  int __type_00;
  int __type_01;
  int res;
  accessor cur;
  accessor max;
  FileRecord fr;
  int local_8c;
  undefined1 local_88 [24];
  undefined1 local_70 [24];
  undefined1 local_58 [8];
  unique_lock<tthread::fast_mutex> local_50 [2];
  
  critical_resource<int,_tthread::fast_mutex>::access
            ((critical_resource<int,_tthread::fast_mutex> *)local_58,(char *)&this->count_,(int)sz);
  iVar1 = *(int *)local_58;
  *(int *)local_58 = iVar1 + 1;
  std::unique_lock<tthread::fast_mutex>::~unique_lock
            ((unique_lock<tthread::fast_mutex> *)(local_58 + 8));
  local_8c = iVar1;
  local_58 = (undefined1  [8])sz;
  std::__cxx11::string::string((string *)(local_58 + 8),(string *)filename);
  critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::access((critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
            *)local_88,(char *)&this->filenames_,__type);
  this_00 = std::
            map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
            ::operator[]((map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
                          *)local_88._0_8_,&local_8c);
  FileRecord::operator=(this_00,(FileRecord *)local_58);
  std::unique_lock<tthread::fast_mutex>::~unique_lock
            ((unique_lock<tthread::fast_mutex> *)(local_88 + 8));
  critical_resource<unsigned_long,_tthread::fast_mutex>::access
            ((critical_resource<unsigned_long,_tthread::fast_mutex> *)local_88,
             (char *)&this->current_size_,__type_00);
  *(size_t *)&((_Rep_type *)local_88._0_8_)->_M_impl =
       *(long *)&((_Rep_type *)local_88._0_8_)->_M_impl + sz;
  critical_resource<unsigned_long,_tthread::fast_mutex>::access
            ((critical_resource<unsigned_long,_tthread::fast_mutex> *)local_70,
             (char *)&this->max_size_,__type_01);
  iVar1 = local_8c;
  uVar2 = *(ulong *)&((_Rep_type *)local_88._0_8_)->_M_impl;
  if (*(ulong *)local_70._0_8_ < uVar2) {
    *(ulong *)local_70._0_8_ = uVar2;
  }
  std::unique_lock<tthread::fast_mutex>::~unique_lock
            ((unique_lock<tthread::fast_mutex> *)(local_70 + 8));
  std::unique_lock<tthread::fast_mutex>::~unique_lock
            ((unique_lock<tthread::fast_mutex> *)(local_88 + 8));
  std::__cxx11::string::~string((string *)(local_58 + 8));
  return iVar1;
}

Assistant:

int           make_file_record(const std::string& filename, size_t sz)
      {
        int res = (*count_.access())++;
        FileRecord  fr = { sz, filename };
        (*filenames_.access())[res] = fr;

        // keep track of sizes
        critical_resource<size_t>::accessor     cur = current_size_.access();
        *cur += sz;
        critical_resource<size_t>::accessor     max = max_size_.access();
        if (*cur > *max)
            *max = *cur;

        return res;
      }